

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathRandom.h
# Opt level: O2

Vec3<float> __thiscall
Imath_3_2::hollowSphereRand<Imath_3_2::Vec3<float>,Imath_3_2::Rand48>(Imath_3_2 *this,Rand48 *rand)

{
  uint i;
  long lVar1;
  double dVar2;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Vec3<float> VVar5;
  Vec3<float> v;
  Vec3<float> local_30;
  
  lVar1 = 0;
  do {
    do {
      for (; lVar1 != 3; lVar1 = lVar1 + 1) {
        dVar2 = (double)Imath_3_2::erand48(rand->_state);
        (&local_30.x)[lVar1] = (float)(dVar2 - (1.0 - dVar2));
      }
      VVar5.x = Vec3<float>::length(&local_30);
      lVar1 = 0;
    } while (1.0 < VVar5.x);
    lVar1 = 0;
  } while ((VVar5.x == 0.0) && (!NAN(VVar5.x)));
  VVar5.z = local_30.z / VVar5.x;
  auVar3._8_8_ = 0;
  auVar3._0_4_ = local_30.x;
  auVar3._4_4_ = local_30.y;
  auVar4._4_4_ = VVar5.x;
  auVar4._0_4_ = VVar5.x;
  auVar4._8_4_ = extraout_XMM0_Db;
  auVar4._12_4_ = extraout_XMM0_Db;
  auVar4 = divps(auVar3,auVar4);
  *(long *)this = auVar4._0_8_;
  *(float *)(this + 8) = VVar5.z;
  VVar5.y = VVar5.x;
  return VVar5;
}

Assistant:

IMATH_HOSTDEVICE Vec
hollowSphereRand (Rand& rand)
{
    Vec                    v;
    typename Vec::BaseType length;

    do
    {
        for (unsigned int i = 0; i < Vec::dimensions (); i++)
            v[i] = (typename Vec::BaseType) rand.nextf (-1, 1);

        length = v.length ();
    } while (length > 1 || length == 0);

    return v / length;
}